

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

char * duckdb_shell_sqlite3_column_decltype(sqlite3_stmt *pStmt,int iCol)

{
  bool bVar1;
  LogicalTypeId LVar2;
  pointer pPVar3;
  size_type sVar4;
  int in_ESI;
  long in_RDI;
  value_type column_type;
  vector<duckdb::LogicalType,_true> *types;
  LogicalType *in_stack_ffffffffffffff98;
  LogicalType *in_stack_ffffffffffffffa0;
  LogicalType local_38;
  vector<duckdb::LogicalType,_true> *local_20;
  int local_14;
  char *local_8;
  
  if (in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_14 = in_ESI;
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                        *)0x20dda1);
    if (bVar1) {
      duckdb::
      unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
      operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                  *)in_stack_ffffffffffffffa0);
      local_20 = duckdb::PreparedStatement::GetTypes((PreparedStatement *)0x20ddbd);
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
                          *)0x20ddd2);
      if (!bVar1) {
        return (char *)0x0;
      }
      pPVar3 = duckdb::
               unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
               ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                             *)in_stack_ffffffffffffffa0);
      local_20 = &(pPVar3->super_BaseQueryResult).types;
    }
    if ((local_14 < 0) ||
       (sVar4 = std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                          (&local_20->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
       , sVar4 <= (ulong)(long)local_14)) {
      local_8 = (char *)0x0;
    }
    else {
      duckdb::vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffffa0,
                 (size_type)in_stack_ffffffffffffff98);
      duckdb::LogicalType::LogicalType(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      LVar2 = duckdb::LogicalType::id(&local_38);
      switch(LVar2) {
      case BOOLEAN:
        local_8 = "BOOLEAN";
        break;
      case TINYINT:
        local_8 = "TINYINT";
        break;
      case SMALLINT:
        local_8 = "SMALLINT";
        break;
      case INTEGER:
        local_8 = "INTEGER";
        break;
      case BIGINT:
        local_8 = "BIGINT";
        break;
      case DATE:
        local_8 = "DATE";
        break;
      case TIME:
        local_8 = "TIME";
        break;
      case TIMESTAMP_SEC:
      case TIMESTAMP_MS:
      case TIMESTAMP:
      case TIMESTAMP_NS:
        local_8 = "TIMESTAMP";
        break;
      case DECIMAL:
        local_8 = "DECIMAL";
        break;
      case FLOAT:
        local_8 = "FLOAT";
        break;
      case DOUBLE:
        local_8 = "DOUBLE";
        break;
      default:
        local_8 = (char *)0x0;
        break;
      case VARCHAR:
        local_8 = "VARCHAR";
        break;
      case BLOB:
        local_8 = "BLOB";
        break;
      case STRUCT:
        local_8 = "STRUCT";
        break;
      case LIST:
        local_8 = "LIST";
        break;
      case MAP:
        local_8 = "MAP";
      }
      duckdb::LogicalType::~LogicalType((LogicalType *)0x20e03e);
    }
  }
  return local_8;
}

Assistant:

const char *sqlite3_column_decltype(sqlite3_stmt *pStmt, int iCol) {
	if (!pStmt) {
		return nullptr;
	}

	const duckdb::vector<LogicalType> *types;
	if (pStmt->prepared) {
		types = &pStmt->prepared->GetTypes();
	} else if (pStmt->pending) {
		types = &pStmt->pending->types;
	} else {
		return nullptr;
	}
	if (iCol < 0 || types->size() <= static_cast<size_t>(iCol)) {
		return nullptr;
	}

	auto column_type = (*types)[iCol];
	switch (column_type.id()) {
	case LogicalTypeId::BOOLEAN:
		return "BOOLEAN";
	case LogicalTypeId::TINYINT:
		return "TINYINT";
	case LogicalTypeId::SMALLINT:
		return "SMALLINT";
	case LogicalTypeId::INTEGER:
		return "INTEGER";
	case LogicalTypeId::BIGINT:
		return "BIGINT";
	case LogicalTypeId::FLOAT:
		return "FLOAT";
	case LogicalTypeId::DOUBLE:
		return "DOUBLE";
	case LogicalTypeId::DECIMAL:
		return "DECIMAL";
	case LogicalTypeId::DATE:
		return "DATE";
	case LogicalTypeId::TIME:
		return "TIME";
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIMESTAMP_SEC:
		return "TIMESTAMP";
	case LogicalTypeId::VARCHAR:
		return "VARCHAR";
	case LogicalTypeId::LIST:
		return "LIST";
	case LogicalTypeId::MAP:
		return "MAP";
	case LogicalTypeId::STRUCT:
		return "STRUCT";
	case LogicalTypeId::BLOB:
		return "BLOB";
	default:
		return NULL;
	}
	return NULL;
}